

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_SETEND(DisasContext_conflict1 *s,arg_SETEND *a)

{
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *args [1];
  TCGTemp *local_18;
  
  uVar1 = s->features;
  if (((uVar1 & 8) != 0) && ((uint)(s->be_data == MO_BE) != (uint)a)) {
    tcg_ctx = s->uc->tcg_ctx;
    local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_setend_aarch64,(TCGTemp *)0x0,1,&local_18);
    (s->base).is_jmp = DISAS_TARGET_1;
  }
  return SUB41(((uint)uVar1 & 8) >> 3,0);
}

Assistant:

static bool trans_SETEND(DisasContext *s, arg_SETEND *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!ENABLE_ARCH_6) {
        return false;
    }
    if (a->E != (s->be_data == MO_BE)) {
        gen_helper_setend(tcg_ctx, tcg_ctx->cpu_env);
        s->base.is_jmp = DISAS_UPDATE;
    }
    return true;
}